

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddRead.c
# Opt level: O0

int Cudd_addRead(FILE *fp,DdManager *dd,DdNode **E,DdNode ***x,DdNode ***y,DdNode ***xn,
                DdNode ***yn_,int *nx,int *ny,int *m,int *n,int bx,int sx,int by,int sy)

{
  long lVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode **local_d0;
  DdNode **local_c8;
  DdNode **local_c0;
  DdNode **local_b8;
  DdNode **local_b0;
  DdNode **lyn;
  DdNode **lxn;
  DdNode **ly;
  DdNode **lx;
  double val;
  int local_80;
  int lny;
  int lnx;
  int nv;
  int i;
  int err;
  int v;
  int u;
  DdNode *minterm1;
  DdNode *neW;
  DdNode *w;
  DdNode *zero;
  DdNode *one;
  DdNode ***xn_local;
  DdNode ***y_local;
  DdNode ***x_local;
  DdNode **E_local;
  DdManager *dd_local;
  FILE *fp_local;
  
  zero = dd->one;
  w = dd->zero;
  one = (DdNode *)xn;
  xn_local = y;
  y_local = x;
  x_local = (DdNode ***)E;
  E_local = (DdNode **)dd;
  dd_local = (DdManager *)fp;
  nv = __isoc99_fscanf(fp,"%d %d",&err,&i);
  if (nv == -1) {
    fp_local._4_4_ = 0;
  }
  else if (nv == 2) {
    *m = err;
    ly = *y_local;
    lyn = *(DdNode ***)one;
    local_80 = 0;
    for (err = err + -1; 0 < err; err = err >> 1) {
      local_80 = local_80 + 1;
    }
    if (*nx < local_80) {
      if (*y_local == (DdNode **)0x0) {
        local_b8 = (DdNode **)malloc((long)local_80 << 3);
      }
      else {
        local_b8 = (DdNode **)realloc(*y_local,(long)local_80 << 3);
      }
      ly = local_b8;
      *y_local = local_b8;
      if (local_b8 == (DdNode **)0x0) {
        *(undefined4 *)(E_local + 0x4e) = 1;
        return 0;
      }
      lVar1._0_4_ = one->index;
      lVar1._4_4_ = one->ref;
      if (lVar1 == 0) {
        local_c0 = (DdNode **)malloc((long)local_80 << 3);
      }
      else {
        local_c0 = (DdNode **)realloc(*(void **)one,(long)local_80 << 3);
      }
      lyn = local_c0;
      *(DdNode ***)one = local_c0;
      if (local_c0 == (DdNode **)0x0) {
        *(undefined4 *)(E_local + 0x4e) = 1;
        return 0;
      }
    }
    *n = i;
    lxn = *xn_local;
    local_b0 = *yn_;
    val._4_4_ = 0;
    for (i = i + -1; 0 < i; i = i >> 1) {
      val._4_4_ = val._4_4_ + 1;
    }
    if (*ny < val._4_4_) {
      if (*xn_local == (DdNode **)0x0) {
        local_c8 = (DdNode **)malloc((long)val._4_4_ << 3);
      }
      else {
        local_c8 = (DdNode **)realloc(*xn_local,(long)val._4_4_ << 3);
      }
      lxn = local_c8;
      *xn_local = local_c8;
      if (local_c8 == (DdNode **)0x0) {
        *(undefined4 *)(E_local + 0x4e) = 1;
        return 0;
      }
      if (*yn_ == (DdNode **)0x0) {
        local_d0 = (DdNode **)malloc((long)val._4_4_ << 3);
      }
      else {
        local_d0 = (DdNode **)realloc(*yn_,(long)val._4_4_ << 3);
      }
      local_b0 = local_d0;
      *yn_ = local_d0;
      if (local_d0 == (DdNode **)0x0) {
        *(undefined4 *)(E_local + 0x4e) = 1;
        return 0;
      }
    }
    lny = bx + *nx * sx;
    for (lnx = *nx; lnx < local_80; lnx = lnx + 1) {
      do {
        *(undefined4 *)(E_local + 0x38) = 0;
        pDVar3 = cuddUniqueInter((DdManager *)E_local,lny,zero,w);
        ly[lnx] = pDVar3;
      } while (*(int *)(E_local + 0x38) == 1);
      if (ly[lnx] == (DdNode *)0x0) {
        return 0;
      }
      *(int *)(((ulong)ly[lnx] & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)ly[lnx] & 0xfffffffffffffffe) + 4) + 1;
      do {
        *(undefined4 *)(E_local + 0x38) = 0;
        pDVar3 = cuddUniqueInter((DdManager *)E_local,lny,w,zero);
        lyn[lnx] = pDVar3;
      } while (*(int *)(E_local + 0x38) == 1);
      if (lyn[lnx] == (DdNode *)0x0) {
        return 0;
      }
      *(int *)(((ulong)lyn[lnx] & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)lyn[lnx] & 0xfffffffffffffffe) + 4) + 1;
      lny = sx + lny;
    }
    lny = by + *ny * sy;
    for (lnx = *ny; lnx < val._4_4_; lnx = lnx + 1) {
      do {
        *(undefined4 *)(E_local + 0x38) = 0;
        pDVar3 = cuddUniqueInter((DdManager *)E_local,lny,zero,w);
        lxn[lnx] = pDVar3;
      } while (*(int *)(E_local + 0x38) == 1);
      if (lxn[lnx] == (DdNode *)0x0) {
        return 0;
      }
      *(int *)(((ulong)lxn[lnx] & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)lxn[lnx] & 0xfffffffffffffffe) + 4) + 1;
      do {
        *(undefined4 *)(E_local + 0x38) = 0;
        pDVar3 = cuddUniqueInter((DdManager *)E_local,lny,w,zero);
        local_b0[lnx] = pDVar3;
      } while (*(int *)(E_local + 0x38) == 1);
      if (local_b0[lnx] == (DdNode *)0x0) {
        return 0;
      }
      *(int *)(((ulong)local_b0[lnx] & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)local_b0[lnx] & 0xfffffffffffffffe) + 4) + 1;
      lny = sy + lny;
    }
    *nx = local_80;
    *ny = val._4_4_;
    *x_local = (DdNode **)E_local[9];
    *(int *)(((ulong)*x_local & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)*x_local & 0xfffffffffffffffe) + 4) + 1;
    while ((iVar2 = feof((FILE *)dd_local), iVar2 == 0 &&
           (iVar2 = __isoc99_fscanf(dd_local,"%d %d %lf",&err,&i,&lx), iVar2 != -1))) {
      if (iVar2 != 3) {
        return 0;
      }
      if ((((*m <= err) || (*n <= i)) || (err < 0)) || (i < 0)) {
        return 0;
      }
      _v = zero;
      *(int *)(((ulong)zero & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)zero & 0xfffffffffffffffe) + 4) + 1;
      nv = 3;
      lnx = local_80;
      while (lnx = lnx + -1, iVar2 = val._4_4_, -1 < lnx) {
        if ((err & 1U) == 0) {
          neW = Cudd_addApply((DdManager *)E_local,Cudd_addTimes,_v,lyn[lnx]);
        }
        else {
          neW = Cudd_addApply((DdManager *)E_local,Cudd_addTimes,_v,ly[lnx]);
        }
        if (neW == (DdNode *)0x0) {
          Cudd_RecursiveDeref((DdManager *)E_local,_v);
          return 0;
        }
        *(int *)(((ulong)neW & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)neW & 0xfffffffffffffffe) + 4) + 1;
        Cudd_RecursiveDeref((DdManager *)E_local,_v);
        _v = neW;
        err = err >> 1;
      }
      while (lnx = iVar2 + -1, -1 < lnx) {
        if ((i & 1U) == 0) {
          neW = Cudd_addApply((DdManager *)E_local,Cudd_addTimes,_v,local_b0[lnx]);
        }
        else {
          neW = Cudd_addApply((DdManager *)E_local,Cudd_addTimes,_v,lxn[lnx]);
        }
        if (neW == (DdNode *)0x0) {
          Cudd_RecursiveDeref((DdManager *)E_local,_v);
          return 0;
        }
        *(int *)(((ulong)neW & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)neW & 0xfffffffffffffffe) + 4) + 1;
        Cudd_RecursiveDeref((DdManager *)E_local,_v);
        _v = neW;
        i = i >> 1;
        iVar2 = lnx;
      }
      minterm1 = cuddUniqueConst((DdManager *)E_local,(double)lx);
      if (minterm1 == (DdNode *)0x0) {
        Cudd_RecursiveDeref((DdManager *)E_local,_v);
        return 0;
      }
      *(int *)(((ulong)minterm1 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)minterm1 & 0xfffffffffffffffe) + 4) + 1;
      neW = Cudd_addIte((DdManager *)E_local,_v,minterm1,(DdNode *)*x_local);
      if (neW == (DdNode *)0x0) {
        Cudd_RecursiveDeref((DdManager *)E_local,_v);
        Cudd_RecursiveDeref((DdManager *)E_local,minterm1);
        return 0;
      }
      *(int *)(((ulong)neW & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)neW & 0xfffffffffffffffe) + 4) + 1;
      Cudd_RecursiveDeref((DdManager *)E_local,_v);
      Cudd_RecursiveDeref((DdManager *)E_local,minterm1);
      Cudd_RecursiveDeref((DdManager *)E_local,(DdNode *)*x_local);
      *x_local = (DdNode **)neW;
    }
    fp_local._4_4_ = 1;
  }
  else {
    fp_local._4_4_ = 0;
  }
  return fp_local._4_4_;
}

Assistant:

int
Cudd_addRead(
  FILE * fp /* input file pointer */,
  DdManager * dd /* DD manager */,
  DdNode ** E /* characteristic function of the graph */,
  DdNode *** x /* array of row variables */,
  DdNode *** y /* array of column variables */,
  DdNode *** xn /* array of complemented row variables */,
  DdNode *** yn_ /* array of complemented column variables */,
  int * nx /* number or row variables */,
  int * ny /* number or column variables */,
  int * m /* number of rows */,
  int * n /* number of columns */,
  int  bx /* first index of row variables */,
  int  sx /* step of row variables */,
  int  by /* first index of column variables */,
  int  sy /* step of column variables */)
{
    DdNode *one, *zero;
    DdNode *w, *neW;
    DdNode *minterm1;
    int u, v, err, i, nv;
    int lnx, lny;
    CUDD_VALUE_TYPE val;
    DdNode **lx, **ly, **lxn, **lyn;

    one = DD_ONE(dd);
    zero = DD_ZERO(dd);

    err = fscanf(fp, "%d %d", &u, &v);
    if (err == EOF) {
        return(0);
    } else if (err != 2) {
        return(0);
    }

    *m = u;
    /* Compute the number of x variables. */
    lx = *x; lxn = *xn;
    u--;        /* row and column numbers start from 0 */
    for (lnx=0; u > 0; lnx++) {
        u >>= 1;
    }
    /* Here we rely on the fact that REALLOC of a null pointer is
    ** translates to an ALLOC.
    */
    if (lnx > *nx) {
        *x = lx = ABC_REALLOC(DdNode *, *x, lnx);
        if (lx == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        *xn = lxn =  ABC_REALLOC(DdNode *, *xn, lnx);
        if (lxn == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
    }

    *n = v;
    /* Compute the number of y variables. */
    ly = *y; lyn = *yn_;
    v--;        /* row and column numbers start from 0 */
    for (lny=0; v > 0; lny++) {
        v >>= 1;
    }
    /* Here we rely on the fact that REALLOC of a null pointer is
    ** translates to an ALLOC.
    */
    if (lny > *ny) {
        *y = ly = ABC_REALLOC(DdNode *, *y, lny);
        if (ly == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        *yn_ = lyn =  ABC_REALLOC(DdNode *, *yn_, lny);
        if (lyn == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
    }

    /* Create all new variables. */
    for (i = *nx, nv = bx + (*nx) * sx; i < lnx; i++, nv += sx) {
        do {
            dd->reordered = 0;
            lx[i] = cuddUniqueInter(dd, nv, one, zero);
        } while (dd->reordered == 1);
        if (lx[i] == NULL) return(0);
        cuddRef(lx[i]);
        do {
            dd->reordered = 0;
            lxn[i] = cuddUniqueInter(dd, nv, zero, one);
        } while (dd->reordered == 1);
        if (lxn[i] == NULL) return(0);
        cuddRef(lxn[i]);
    }
    for (i = *ny, nv = by + (*ny) * sy; i < lny; i++, nv += sy) {
        do {
            dd->reordered = 0;
            ly[i] = cuddUniqueInter(dd, nv, one, zero);
        } while (dd->reordered == 1);
        if (ly[i] == NULL) return(0);
        cuddRef(ly[i]);
        do {
            dd->reordered = 0;
            lyn[i] = cuddUniqueInter(dd, nv, zero, one);
        } while (dd->reordered == 1);
        if (lyn[i] == NULL) return(0);
        cuddRef(lyn[i]);
    }
    *nx = lnx;
    *ny = lny;

    *E = dd->background; /* this call will never cause reordering */
    cuddRef(*E);

    while (! feof(fp)) {
        err = fscanf(fp, "%d %d %lf", &u, &v, &val);
        if (err == EOF) {
            break;
        } else if (err != 3) {
            return(0);
        } else if (u >= *m || v >= *n || u < 0 || v < 0) {
            return(0);
        }
 
        minterm1 = one; cuddRef(minterm1);

        /* Build minterm1 corresponding to this arc */
        for (i = lnx - 1; i>=0; i--) {
            if (u & 1) {
                w = Cudd_addApply(dd, Cudd_addTimes, minterm1, lx[i]);
            } else {
                w = Cudd_addApply(dd, Cudd_addTimes, minterm1, lxn[i]);
            }
            if (w == NULL) {
                Cudd_RecursiveDeref(dd, minterm1);
                return(0);
            }
            cuddRef(w);
            Cudd_RecursiveDeref(dd, minterm1);
            minterm1 = w;
            u >>= 1;
        }
        for (i = lny - 1; i>=0; i--) {
            if (v & 1) {
                w = Cudd_addApply(dd, Cudd_addTimes, minterm1, ly[i]);
            } else {
                w = Cudd_addApply(dd, Cudd_addTimes, minterm1, lyn[i]);
            }
            if (w == NULL) {
                Cudd_RecursiveDeref(dd, minterm1);
                return(0);
            }
            cuddRef(w);
            Cudd_RecursiveDeref(dd, minterm1);
            minterm1 = w;
            v >>= 1;
        }
        /* Create new constant node if necessary.
        ** This call will never cause reordering.
        */
        neW = cuddUniqueConst(dd, val);
        if (neW == NULL) {
            Cudd_RecursiveDeref(dd, minterm1);
            return(0);
        }
        cuddRef(neW);

        w = Cudd_addIte(dd, minterm1, neW, *E);
        if (w == NULL) {
            Cudd_RecursiveDeref(dd, minterm1);
            Cudd_RecursiveDeref(dd, neW);
            return(0);
        }
        cuddRef(w);
        Cudd_RecursiveDeref(dd, minterm1);
        Cudd_RecursiveDeref(dd, neW);
        Cudd_RecursiveDeref(dd, *E);
        *E = w;
    }
    return(1);

}